

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iidentity8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar16 = *(int *)((long)*in + 4);
  lVar8 = (*in)[1];
  iVar1 = *(int *)((long)*in + 0xc);
  *(int *)*out = (int)(*in)[0] * 2;
  *(int *)((long)*out + 4) = iVar16 * 2;
  *(int *)(*out + 1) = (int)lVar8 * 2;
  *(int *)((long)*out + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[1] + 4);
  lVar8 = in[1][1];
  iVar1 = *(int *)((long)in[1] + 0xc);
  *(int *)out[1] = (int)in[1][0] * 2;
  *(int *)((long)out[1] + 4) = iVar16 * 2;
  *(int *)(out[1] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[1] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[2] + 4);
  lVar8 = in[2][1];
  iVar1 = *(int *)((long)in[2] + 0xc);
  *(int *)out[2] = (int)in[2][0] * 2;
  *(int *)((long)out[2] + 4) = iVar16 * 2;
  *(int *)(out[2] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[2] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[3] + 4);
  lVar8 = in[3][1];
  iVar1 = *(int *)((long)in[3] + 0xc);
  *(int *)out[3] = (int)in[3][0] * 2;
  *(int *)((long)out[3] + 4) = iVar16 * 2;
  *(int *)(out[3] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[3] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[4] + 4);
  lVar8 = in[4][1];
  iVar1 = *(int *)((long)in[4] + 0xc);
  *(int *)out[4] = (int)in[4][0] * 2;
  *(int *)((long)out[4] + 4) = iVar16 * 2;
  *(int *)(out[4] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[4] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[5] + 4);
  lVar8 = in[5][1];
  iVar1 = *(int *)((long)in[5] + 0xc);
  *(int *)out[5] = (int)in[5][0] * 2;
  *(int *)((long)out[5] + 4) = iVar16 * 2;
  *(int *)(out[5] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[5] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[6] + 4);
  lVar8 = in[6][1];
  iVar1 = *(int *)((long)in[6] + 0xc);
  *(int *)out[6] = (int)in[6][0] * 2;
  *(int *)((long)out[6] + 4) = iVar16 * 2;
  *(int *)(out[6] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[6] + 0xc) = iVar1 * 2;
  iVar16 = *(int *)((long)in[7] + 4);
  lVar8 = in[7][1];
  iVar1 = *(int *)((long)in[7] + 0xc);
  *(int *)out[7] = (int)in[7][0] * 2;
  *(int *)((long)out[7] + 4) = iVar16 * 2;
  *(int *)(out[7] + 1) = (int)lVar8 * 2;
  *(int *)((long)out[7] + 0xc) = iVar1 * 2;
  if (do_cols != 0) {
    return;
  }
  iVar16 = 10;
  if (10 < bd) {
    iVar16 = bd;
  }
  local_28 = 0x20 << ((byte)iVar16 & 0x1f);
  local_18 = -local_28;
  local_28 = local_28 + -1;
  if (out_shift != 0) {
    iVar15 = 1 << ((char)out_shift - 1U & 0x1f);
    iVar16 = *(int *)((long)*out + 4);
    lVar8 = (*out)[1];
    iVar1 = *(int *)((long)*out + 0xc);
    lVar9 = out[1][0];
    iVar2 = *(int *)((long)out[1] + 4);
    lVar10 = out[1][1];
    iVar3 = *(int *)((long)out[1] + 0xc);
    lVar11 = out[2][0];
    iVar4 = *(int *)((long)out[2] + 4);
    lVar12 = out[2][1];
    iVar5 = *(int *)((long)out[2] + 0xc);
    lVar13 = out[3][0];
    iVar6 = *(int *)((long)out[3] + 4);
    lVar14 = out[3][1];
    iVar7 = *(int *)((long)out[3] + 0xc);
    auVar17 = ZEXT416((uint)out_shift);
    *(int *)*out = (int)(*out)[0] + iVar15 >> auVar17;
    *(int *)((long)*out + 4) = iVar16 + iVar15 >> auVar17;
    *(int *)(*out + 1) = (int)lVar8 + iVar15 >> auVar17;
    *(int *)((long)*out + 0xc) = iVar1 + iVar15 >> auVar17;
    *(int *)out[1] = (int)lVar9 + iVar15 >> auVar17;
    *(int *)((long)out[1] + 4) = iVar2 + iVar15 >> auVar17;
    *(int *)(out[1] + 1) = (int)lVar10 + iVar15 >> auVar17;
    *(int *)((long)out[1] + 0xc) = iVar3 + iVar15 >> auVar17;
    *(int *)out[2] = (int)lVar11 + iVar15 >> auVar17;
    *(int *)((long)out[2] + 4) = iVar4 + iVar15 >> auVar17;
    *(int *)(out[2] + 1) = (int)lVar12 + iVar15 >> auVar17;
    *(int *)((long)out[2] + 0xc) = iVar5 + iVar15 >> auVar17;
    *(int *)out[3] = (int)lVar13 + iVar15 >> auVar17;
    *(int *)((long)out[3] + 4) = iVar6 + iVar15 >> auVar17;
    *(int *)(out[3] + 1) = (int)lVar14 + iVar15 >> auVar17;
    *(int *)((long)out[3] + 0xc) = iVar7 + iVar15 >> auVar17;
    iVar16 = *(int *)((long)out[4] + 4);
    lVar8 = out[4][1];
    iVar1 = *(int *)((long)out[4] + 0xc);
    lVar9 = out[5][0];
    iVar2 = *(int *)((long)out[5] + 4);
    lVar10 = out[5][1];
    iVar3 = *(int *)((long)out[5] + 0xc);
    lVar11 = out[6][0];
    iVar4 = *(int *)((long)out[6] + 4);
    lVar12 = out[6][1];
    iVar5 = *(int *)((long)out[6] + 0xc);
    lVar13 = out[7][0];
    iVar6 = *(int *)((long)out[7] + 4);
    lVar14 = out[7][1];
    iVar7 = *(int *)((long)out[7] + 0xc);
    *(int *)out[4] = (int)out[4][0] + iVar15 >> auVar17;
    *(int *)((long)out[4] + 4) = iVar16 + iVar15 >> auVar17;
    *(int *)(out[4] + 1) = (int)lVar8 + iVar15 >> auVar17;
    *(int *)((long)out[4] + 0xc) = iVar1 + iVar15 >> auVar17;
    *(int *)out[5] = (int)lVar9 + iVar15 >> auVar17;
    *(int *)((long)out[5] + 4) = iVar2 + iVar15 >> auVar17;
    *(int *)(out[5] + 1) = (int)lVar10 + iVar15 >> auVar17;
    *(int *)((long)out[5] + 0xc) = iVar3 + iVar15 >> auVar17;
    *(int *)out[6] = (int)lVar11 + iVar15 >> auVar17;
    *(int *)((long)out[6] + 4) = iVar4 + iVar15 >> auVar17;
    *(int *)(out[6] + 1) = (int)lVar12 + iVar15 >> auVar17;
    *(int *)((long)out[6] + 0xc) = iVar5 + iVar15 >> auVar17;
    *(int *)out[7] = iVar15 + (int)lVar13 >> auVar17;
    *(int *)((long)out[7] + 4) = iVar15 + iVar6 >> auVar17;
    *(int *)(out[7] + 1) = iVar15 + (int)lVar14 >> auVar17;
    *(int *)((long)out[7] + 0xc) = iVar15 + iVar7 >> auVar17;
  }
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  iStack_14 = local_18;
  iStack_10 = local_18;
  iStack_c = local_18;
  highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,8);
  return;
}

Assistant:

static void iidentity8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  (void)bit;
  out[0] = _mm_add_epi32(in[0], in[0]);
  out[1] = _mm_add_epi32(in[1], in[1]);
  out[2] = _mm_add_epi32(in[2], in[2]);
  out[3] = _mm_add_epi32(in[3], in[3]);
  out[4] = _mm_add_epi32(in[4], in[4]);
  out[5] = _mm_add_epi32(in[5], in[5]);
  out[6] = _mm_add_epi32(in[6], in[6]);
  out[7] = _mm_add_epi32(in[7], in[7]);

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 8);
  }
}